

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O3

void __thiscall FArchive::WriteSprite(FArchive *this,int spritenum)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  BYTE id;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  
  uVar5 = 0;
  if ((uint)spritenum < sprites.Count) {
    uVar5 = (ulong)(uint)spritenum;
  }
  iVar3 = (int)uVar5;
  if (this->m_SpriteMap[iVar3] < 0) {
    sVar1 = this->m_NumSprites;
    this->m_NumSprites = sVar1 + 1;
    this->m_SpriteMap[iVar3] = (int)sVar1;
    (*this->_vptr_FArchive[2])(this,&local_23,1);
    (*this->_vptr_FArchive[2])(this,sprites.Array + iVar3,4);
    do {
      uVar4 = (uint)uVar5;
      (*this->_vptr_FArchive[2])(this,&local_22,1);
      uVar5 = uVar5 >> 7;
    } while (0x7f < uVar4);
  }
  else {
    (*this->_vptr_FArchive[2])(this,&local_23,1);
    uVar4 = this->m_SpriteMap[iVar3];
    do {
      (*this->_vptr_FArchive[2])(this,&local_21,1);
      bVar2 = 0x7f < uVar4;
      uVar4 = uVar4 >> 7;
    } while (bVar2);
  }
  return;
}

Assistant:

void FCompressedFile::Explode ()
{
	uLong expandsize, cprlen;
	unsigned char *expand;

	if (m_Buffer)
	{
		unsigned int *ints = (unsigned int *)(m_Buffer);
		cprlen = BigLong(ints[0]);
		expandsize = BigLong(ints[1]);
		
		expand = (unsigned char *)M_Malloc (expandsize);
		if (cprlen)
		{
			int r;
			uLong newlen;

			newlen = expandsize;
			r = uncompress (expand, &newlen, m_Buffer + 8, cprlen);
			if (r != Z_OK || newlen != expandsize)
			{
				M_Free (expand);
				I_Error ("Could not decompress buffer: %s", M_ZLibError(r).GetChars());
			}
		}
		else
		{
			memcpy (expand, m_Buffer + 8, expandsize);
		}
		if (FreeOnExplode ())
			M_Free (m_Buffer);
		m_Buffer = expand;
		m_BufferSize = expandsize;
	}
}